

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall
kj::_::ExclusiveJoinPromiseNode::Branch::Branch
          (Branch *this,ExclusiveJoinPromiseNode *joinNode,OwnPromiseNode dependencyParam,
          SourceLocation location)

{
  PromiseNode *pPVar1;
  EventLoop *pEVar2;
  
  (this->super_Event)._vptr_Event = (_func_int **)&PTR___cxa_pure_virtual_0037fa40;
  pEVar2 = anon_unknown_173::currentEventLoop();
  (this->super_Event).loop = pEVar2;
  (this->super_Event).next = (Event *)0x0;
  (this->super_Event).prev = (Event **)0x0;
  (this->super_Event).firing = false;
  (this->super_Event).live = 0x1e366381;
  *(undefined4 *)&(this->super_Event).location.fileName = location.fileName._0_4_;
  *(undefined4 *)((long)&(this->super_Event).location.fileName + 4) = location.fileName._4_4_;
  *(undefined4 *)&(this->super_Event).location.function = location.function._0_4_;
  *(undefined4 *)((long)&(this->super_Event).location.function + 4) = location.function._4_4_;
  (this->super_Event).location.lineNumber = location.lineNumber;
  (this->super_Event).location.columnNumber = location.columnNumber;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_traceEvent_0037f040;
  this->joinNode = joinNode;
  (this->dependency).ptr =
       (PromiseNode *)((dependencyParam.ptr)->super_PromiseArenaMember)._vptr_PromiseArenaMember;
  ((dependencyParam.ptr)->super_PromiseArenaMember)._vptr_PromiseArenaMember = (_func_int **)0x0;
  pPVar1 = (this->dependency).ptr;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[2])(pPVar1,&this->dependency);
  pPVar1 = (this->dependency).ptr;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])(pPVar1,this);
  return;
}

Assistant:

ExclusiveJoinPromiseNode::Branch::Branch(
    ExclusiveJoinPromiseNode& joinNode, OwnPromiseNode dependencyParam, SourceLocation location)
    : Event(location), joinNode(joinNode), dependency(kj::mv(dependencyParam)) {
  dependency->setSelfPointer(&dependency);
  dependency->onReady(this);
}